

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O0

void __thiscall MinVR::VRDisplayNode::clearChildren(VRDisplayNode *this,bool destroyChildren)

{
  bool bVar1;
  reference ppVVar2;
  byte in_SIL;
  __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
  *in_RDI;
  iterator it;
  VRDisplayNode *in_stack_ffffffffffffffc8;
  __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
  in_stack_ffffffffffffffd8;
  __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
  local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 != 0) {
    local_18._M_current =
         (VRDisplayNode **)
         std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::begin
                   ((vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *)
                    in_stack_ffffffffffffffc8);
    while( true ) {
      std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::end
                ((vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *)
                 in_stack_ffffffffffffffc8);
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                                 *)in_stack_ffffffffffffffc8);
      if (!bVar1) break;
      ppVVar2 = __gnu_cxx::
                __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                ::operator*(&local_18);
      in_stack_ffffffffffffffc8 = *ppVVar2;
      if (in_stack_ffffffffffffffc8 != (VRDisplayNode *)0x0) {
        (*in_stack_ffffffffffffffc8->_vptr_VRDisplayNode[1])();
      }
      in_stack_ffffffffffffffd8 =
           __gnu_cxx::
           __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
           ::operator++(in_stack_ffffffffffffffd8._M_current,(int)((ulong)in_RDI >> 0x20));
    }
  }
  std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::clear
            ((vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *)0x16d3a4);
  return;
}

Assistant:

void VRDisplayNode::clearChildren(bool destroyChildren) {
	if (destroyChildren) {
		for (std::vector<VRDisplayNode*>::iterator it = _children.begin(); it != _children.end(); it++) {
				delete (*it);
		}
	}

	_children.clear();
}